

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void retro_set_environment(retro_environment_t cb)

{
  _Bool _Var1;
  undefined1 local_58 [8];
  retro_variable variables [3];
  undefined1 local_19;
  retro_log_printf_t p_Stack_18;
  _Bool no_rom;
  retro_log_callback logging;
  retro_environment_t cb_local;
  
  env_cb = cb;
  logging.log = (retro_log_printf_t)cb;
  memset(&stack0xffffffffffffffe8,0,8);
  _Var1 = (*env_cb)(0x1b,&stack0xffffffffffffffe8);
  if (_Var1) {
    log_cb = p_Stack_18;
  }
  else {
    log_cb = fallback_log;
  }
  gb_log_set_handler(log_handler);
  local_19 = 1;
  (*env_cb)(0x12,&local_19);
  memcpy(local_58,&PTR_anon_var_dwarf_51da_00113d00,0x30);
  (*env_cb)(0x10,local_58);
  return;
}

Assistant:

void retro_set_environment(retro_environment_t cb)
{
   env_cb = cb;

   struct retro_log_callback logging = {0};
   if(env_cb(RETRO_ENVIRONMENT_GET_LOG_INTERFACE, &logging))
      log_cb = logging.log;
   else
      log_cb = fallback_log;

   gb_log_set_handler(log_handler);

   bool no_rom = true;
   env_cb(RETRO_ENVIRONMENT_SET_SUPPORT_NO_GAME, &no_rom);

   /// Definition of core variables (aka "Core Options")

   struct retro_variable variables[] =
   {
      { "gb_color", "Screen coloring; Gray|Green" },
      { "gb_bootrom_skip", "Skip BootROM; false|true" },
      { NULL, NULL }
   };

   env_cb(RETRO_ENVIRONMENT_SET_VARIABLES, variables);
}